

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_compile(HSQUIRRELVM v,SQChar *s,SQInteger size,SQChar *sourcename,SQBool raiseerror,
                   HSQOBJECT *bindings)

{
  bool bVar1;
  SQVM *this;
  SQObjectValue in_RDI;
  uint uVar2;
  SQObjectPtr o;
  bool in_stack_000001ae;
  bool in_stack_000001af;
  SQObjectPtr *in_stack_000001b0;
  SQChar *in_stack_000001b8;
  HSQOBJECT *in_stack_000001c0;
  size_t in_stack_000001c8;
  char *in_stack_000001d0;
  SQVM *in_stack_000001d8;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SQFunctionProto *func;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SQObjectPtr local_68 [2];
  SQObjectValue local_10;
  SQRESULT local_8;
  
  func = (SQFunctionProto *)&stack0xffffffffffffffb8;
  local_10 = in_RDI;
  SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar2 = (local_10.pThread)->_sharedstate->_debuginfo & 1;
  bVar1 = SQCompilation::Compile
                    (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                     in_stack_000001b8,in_stack_000001b0,in_stack_000001af,in_stack_000001ae);
  if (bVar1) {
    this = (SQVM *)SQClosure::Create((SQSharedState *)
                                     CONCAT44(in_stack_ffffffffffffff94,
                                              CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90)),func)
    ;
    SQObjectPtr::SQObjectPtr(local_68,(SQClosure *)this);
    SQVM::Push(this,(SQObjectPtr *)local_10.pTable);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,uVar2));
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,uVar2));
  return local_8;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v, const SQChar *s, SQInteger size, const SQChar *sourcename,SQBool raiseerror,const HSQOBJECT *bindings)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, s, size, bindings, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}